

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          size_t size,align_spec *spec,inf_or_nan_writer f)

{
  ulong n;
  ulong uVar1;
  char_type fill;
  wchar_t local_3c;
  type local_38;
  inf_or_nan_writer local_30 [8];
  char *local_28;
  
  local_28 = f.str;
  local_30[0] = (inf_or_nan_writer)f.sign;
  n = (ulong)spec->width_;
  uVar1 = n - size;
  if (n < size || uVar1 == 0) {
    local_38 = internal::reserve<fmt::v5::internal::basic_buffer<wchar_t>>
                         ((back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_> *)this,
                          size);
    inf_or_nan_writer::operator()(local_30,&local_38);
  }
  else {
    local_38 = internal::reserve<fmt::v5::internal::basic_buffer<wchar_t>>
                         ((back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_> *)this,n)
    ;
    local_3c = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      local_38 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_38,uVar1 >> 1,&local_3c);
      inf_or_nan_writer::operator()(local_30,&local_38);
      uVar1 = uVar1 - (uVar1 >> 1);
    }
    else {
      if (spec->align_ == ALIGN_RIGHT) {
        local_38 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_38,uVar1,&local_3c);
        inf_or_nan_writer::operator()(local_30,&local_38);
        return;
      }
      inf_or_nan_writer::operator()(local_30,&local_38);
    }
    std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_38,uVar1,&local_3c);
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}